

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

int ntoh_cmp(void *a,void *b)

{
  long lVar1;
  long lVar2;
  char *__s1;
  char *__s2;
  undefined4 local_40;
  undefined4 local_3c;
  int g2;
  int g1;
  PClassWeapon *c2;
  PClassWeapon *c1;
  void *b_local;
  void *a_local;
  
  lVar1 = *a;
  lVar2 = *b;
  if (*(char *)(lVar1 + 0xfc) == '\0') {
    local_3c = 1;
  }
  else {
    local_3c = 2;
    if ((*(byte *)(lVar1 + 0xfc) & gameinfo.gametype) != GAME_Any) {
      local_3c = 0;
    }
  }
  if (*(char *)(lVar2 + 0xfc) == '\0') {
    local_40 = 1;
  }
  else {
    local_40 = 2;
    if ((*(byte *)(lVar2 + 0xfc) & gameinfo.gametype) != GAME_Any) {
      local_40 = 0;
    }
  }
  if (local_3c == local_40) {
    __s1 = FName::GetChars((FName *)(lVar1 + 0x88));
    __s2 = FName::GetChars((FName *)(lVar2 + 0x88));
    a_local._4_4_ = strcasecmp(__s1,__s2);
  }
  else {
    a_local._4_4_ = local_3c - local_40;
  }
  return a_local._4_4_;
}

Assistant:

static int ntoh_cmp(const void *a, const void *b)
{
	PClassWeapon *c1 = *(PClassWeapon **)a;
	PClassWeapon *c2 = *(PClassWeapon **)b;
	int g1 = c1->GameFilter == GAME_Any ? 1 : (c1->GameFilter & gameinfo.gametype) ? 0 : 2;
	int g2 = c2->GameFilter == GAME_Any ? 1 : (c2->GameFilter & gameinfo.gametype) ? 0 : 2;
	if (g1 != g2)
	{
		return g1 - g2;
	}
	return stricmp(c1->TypeName.GetChars(), c2->TypeName.GetChars());
}